

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigSwitch.c
# Opt level: O0

Aig_CMan_t * Aig_CManCreate(Aig_Man_t *p)

{
  int iVar1;
  int iVar2;
  int nOuts;
  uint uVar3;
  uint uVar4;
  Aig_CMan_t *p_00;
  Aig_Obj_t *pAVar5;
  int local_24;
  int i;
  Aig_Obj_t *pObj;
  Aig_CMan_t *pCMan;
  Aig_Man_t *p_local;
  
  iVar1 = Aig_ManCiNum(p);
  iVar2 = Aig_ManNodeNum(p);
  nOuts = Aig_ManCoNum(p);
  p_00 = Aig_CManStart(iVar1,iVar2,nOuts);
  for (local_24 = 0; iVar1 = Vec_PtrSize(p->vObjs), local_24 < iVar1; local_24 = local_24 + 1) {
    pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(p->vObjs,local_24);
    if ((pAVar5 != (Aig_Obj_t *)0x0) && (iVar1 = Aig_ObjIsNode(pAVar5), iVar1 != 0)) {
      iVar1 = Aig_ObjFaninId0(pAVar5);
      uVar4 = Aig_ObjFaninC0(pAVar5);
      iVar2 = Aig_ObjFaninId1(pAVar5);
      uVar3 = Aig_ObjFaninC1(pAVar5);
      Aig_CManAddNode(p_00,iVar1 << 1 | uVar4,iVar2 << 1 | uVar3);
    }
  }
  for (local_24 = 0; iVar1 = Vec_PtrSize(p->vCos), local_24 < iVar1; local_24 = local_24 + 1) {
    pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(p->vCos,local_24);
    iVar1 = Aig_ObjFaninId0(pAVar5);
    uVar4 = Aig_ObjFaninC0(pAVar5);
    Aig_CManAddPo(p_00,iVar1 << 1 | uVar4);
  }
  printf("\nBytes alloc = %5d.  Bytes used = %7d.  Ave per node = %4.2f. \n",
         ((double)((long)p_00->pCur - (long)(p_00 + 1)) * 1.0) /
         (double)(p_00->nNodes + p_00->nOuts),(ulong)(uint)p_00->nBytes,
         (ulong)(uint)((int)p_00->pCur - ((int)p_00 + 0x28)));
  return p_00;
}

Assistant:

Aig_CMan_t * Aig_CManCreate( Aig_Man_t * p )
{
    Aig_CMan_t * pCMan;
    Aig_Obj_t * pObj;
    int i;
    pCMan = Aig_CManStart( Aig_ManCiNum(p), Aig_ManNodeNum(p), Aig_ManCoNum(p) );
    Aig_ManForEachNode( p, pObj, i )
        Aig_CManAddNode( pCMan, 
            (Aig_ObjFaninId0(pObj) << 1) | Aig_ObjFaninC0(pObj), 
            (Aig_ObjFaninId1(pObj) << 1) | Aig_ObjFaninC1(pObj) );
    Aig_ManForEachCo( p, pObj, i )
        Aig_CManAddPo( pCMan, 
            (Aig_ObjFaninId0(pObj) << 1) | Aig_ObjFaninC0(pObj) ); 
    printf( "\nBytes alloc = %5d.  Bytes used = %7d.  Ave per node = %4.2f. \n", 
        pCMan->nBytes, (int)(pCMan->pCur - pCMan->Data), 
        1.0 * (pCMan->pCur - pCMan->Data) / (pCMan->nNodes + pCMan->nOuts ) );
//    Aig_CManStop( pCMan );
    return pCMan;
}